

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int gpioStoreScript(char *script)

{
  int *__ptr;
  uint uVar1;
  uint *puVar2;
  pthread_t *ppVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioStoreScript_cold_1();
  }
  if (libInitialised == '\0') {
    uVar4 = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioStoreScript_cold_2();
    }
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&gpioStoreScript::mutex);
    puVar2 = &gpioScript[0].state;
    uVar5 = 0;
    do {
      if (*puVar2 == 0) {
        *puVar2 = 1;
        goto LAB_00120288;
      }
      uVar5 = uVar5 + 1;
      puVar2 = puVar2 + 0x2c;
    } while (uVar5 != 0x20);
    uVar5 = 0xffffffff;
LAB_00120288:
    pthread_mutex_unlock((pthread_mutex_t *)&gpioStoreScript::mutex);
    uVar4 = (uint)uVar5;
    if ((int)uVar4 < 0) {
      uVar4 = 0xffffffc7;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        gpioStoreScript_cold_3();
      }
    }
    else {
      uVar5 = uVar5 & 0xffffffff;
      uVar1 = cmdParseScript(script,&gpioScript[uVar5].script,0);
      if (uVar1 == 0) {
        gpioScript[uVar5].request = 0;
        gpioScript[uVar5].run_state = 0;
        pthread_cond_init((pthread_cond_t *)&gpioScript[uVar5].pthCond,(pthread_condattr_t *)0x0);
        pthread_mutex_init((pthread_mutex_t *)&gpioScript[uVar5].pthMutex,(pthread_mutexattr_t *)0x0
                          );
        gpioScript[uVar5].id = uVar4;
        gpioScript[uVar5].state = 2;
        ppVar3 = gpioStartThread(pthScript,gpioScript + uVar5);
        gpioScript[uVar5].pthIdp = ppVar3;
      }
      else {
        __ptr = gpioScript[uVar5].script.par;
        if (__ptr != (int *)0x0) {
          free(__ptr);
        }
        gpioScript[uVar5].script.par = (int *)0x0;
        gpioScript[uVar5].state = 0;
        uVar4 = uVar1;
      }
    }
  }
  return uVar4;
}

Assistant:

int gpioStoreScript(char *script)
{
   static pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
   gpioScript_t *s;
   int status, slot, i;

   DBG(DBG_USER, "script=[%s]", script);

   CHECK_INITED;

   slot = -1;

   pthread_mutex_lock(&mutex);

   for (i=0; i<PI_MAX_SCRIPTS; i++)
   {
      if (gpioScript[i].state == PI_SCRIPT_FREE)
      {
         slot = i;
         gpioScript[slot].state = PI_SCRIPT_RESERVED;
         break;
      }
   }

   pthread_mutex_unlock(&mutex);

   if (slot < 0) SOFT_ERROR(PI_NO_SCRIPT_ROOM, "no room for scripts");

   s = &gpioScript[slot];

   status = cmdParseScript(script, &s->script, 0);

   if (status == 0)
   {
      s->request   = PI_SCRIPT_HALT;
      s->run_state = PI_SCRIPT_INITING;

      pthread_cond_init(&s->pthCond, NULL);
      pthread_mutex_init(&s->pthMutex, NULL);

      s->id = slot;

      gpioScript[slot].state = PI_SCRIPT_IN_USE;

      s->pthIdp = gpioStartThread(pthScript, s);

      status = slot;
   }
   else
   {
      if (s->script.par) free(s->script.par);
      s->script.par = NULL;
      gpioScript[slot].state = PI_SCRIPT_FREE;
   }

   return status;
}